

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O0

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::swap
          (ImageTemplate<unsigned_char> *this,ImageTemplate<unsigned_char> *image)

{
  long in_RSI;
  long in_RDI;
  
  std::swap<unsigned_int>((uint *)(in_RDI + 8),(uint *)(in_RSI + 8));
  std::swap<unsigned_int>((uint *)(in_RDI + 0xc),(uint *)(in_RSI + 0xc));
  std::swap<unsigned_char>((uchar *)(in_RDI + 0x10),(uchar *)(in_RSI + 0x10));
  std::swap<unsigned_int>((uint *)(in_RDI + 0x14),(uint *)(in_RSI + 0x14));
  std::swap<unsigned_char>((uchar *)(in_RDI + 0x11),(uchar *)(in_RSI + 0x11));
  std::swap<unsigned_char*>((uchar **)(in_RDI + 0x18),(uchar **)(in_RSI + 0x18));
  std::swap<unsigned_char>((uchar *)(in_RDI + 0x20),(uchar *)(in_RSI + 0x20));
  return;
}

Assistant:

void swap( ImageTemplate & image )
        {
            std::swap( _width, image._width );
            std::swap( _height, image._height );

            std::swap( _colorCount, image._colorCount );
            std::swap( _rowSize   , image._rowSize );
            std::swap( _alignment , image._alignment );

            std::swap( _data, image._data );
            std::swap( _type, image._type );
        }